

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O3

string * __thiscall
ninx::parser::element::Block::dump_abi_cxx11_(string *__return_storage_ptr__,Block *this,int level)

{
  pointer puVar1;
  Statement *pSVar2;
  string *psVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  pointer puVar7;
  stringstream s;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  string *local_1c8;
  long local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct((ulong)local_1e8,(char)level);
  local_1c0 = (long)level;
  plVar4 = (long *)std::__cxx11::string::append((char *)local_1e8);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_1f8 = *plVar6;
    lStack_1f0 = plVar4[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *plVar6;
    local_208 = (long *)*plVar4;
  }
  local_200 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_208,local_200)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct((ulong)local_1e8,(char)(level + 1));
  plVar4 = (long *)std::__cxx11::string::append((char *)local_1e8);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_1f8 = *plVar6;
    lStack_1f0 = plVar4[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *plVar6;
    local_208 = (long *)*plVar4;
  }
  local_200 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_208,local_200)
  ;
  poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  local_1c8 = __return_storage_ptr__;
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  puVar1 = (this->statements).
           super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (this->statements).
                super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1) {
    pSVar2 = (puVar7->_M_t).
             super___uniq_ptr_impl<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::Statement_*,_std::default_delete<ninx::parser::element::Statement>_>
             .super__Head_base<0UL,_ninx::parser::element::Statement_*,_false>._M_head_impl;
    (**(code **)((long)(pSVar2->super_ASTElement)._vptr_ASTElement + 0x18))
              (&local_208,pSVar2,level + 1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_208,local_200);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
  }
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct((ulong)local_1e8,(char)local_1c0);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_1e8);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_1f8 = *plVar6;
    lStack_1f0 = plVar4[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *plVar6;
    local_208 = (long *)*plVar4;
  }
  local_200 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_208,local_200)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  psVar3 = local_1c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string ninx::parser::element::Block::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "Block {" << std::endl;
    s << std::string(level + 1, '\t') + "echoing " << this->is_echoing() << std::endl;
    for (auto &statement : statements) {
        s << statement->dump(level + 1) << std::endl;
    }
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}